

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void ecs_map_grow(ecs_map_t *map,int32_t element_count)

{
  int32_t bucket_count_00;
  int32_t bucket_count;
  int32_t target_count;
  int32_t element_count_local;
  ecs_map_t *map_local;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x1d0);
  if (map != (ecs_map_t *)0x0) {
    bucket_count_00 = get_bucket_count(map->count + element_count);
    if (map->bucket_count < bucket_count_00) {
      rehash(map,bucket_count_00);
    }
    return;
  }
  __assert_fail("map != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x1d0,"void ecs_map_grow(ecs_map_t *, int32_t)");
}

Assistant:

void ecs_map_grow(
    ecs_map_t *map, 
    int32_t element_count)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);
    int32_t target_count = map->count + element_count;
    int32_t bucket_count = get_bucket_count(target_count);

    if (bucket_count > map->bucket_count) {
        rehash(map, bucket_count);
    }
}